

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.h
# Opt level: O2

void __thiscall
Deque<int,std::allocator<int>>::copy<std::allocator<int>>
          (Deque<int,std::allocator<int>> *this,Deque<int,_std::allocator<int>_> *other)

{
  DataBlock **ppDVar1;
  ulong uVar2;
  long *plVar3;
  pointer piVar4;
  pointer piVar5;
  DataBlock *pDVar6;
  Deque<int,_std::allocator<int>_> *pDVar7;
  pointer piVar8;
  long lVar9;
  size_t __n;
  long lVar10;
  pointer piVar11;
  DataBlock *block;
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  *local_58;
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  *local_50;
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  *local_48;
  Deque<int,_std::allocator<int>_> *local_40;
  size_t local_38;
  
  local_50 = (RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
              *)(this + 0x30);
  lVar10 = 0;
  local_58 = (RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
              *)(this + 0x60);
  local_48 = (RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
              *)this;
  local_40 = other;
  for (local_38 = 0; pDVar7 = local_40, local_38 != (local_40->current_).size_;
      local_38 = local_38 + 1) {
    block = (DataBlock *)operator_new(0x18);
    ppDVar1 = (pDVar7->current_).begin_;
    uVar2 = (pDVar7->current_).allocSize_;
    if ((ulong)((long)ppDVar1 + (lVar10 - (long)(pDVar7->current_).arr_) >> 3) < uVar2) {
      lVar9 = 0;
    }
    else {
      lVar9 = -uVar2;
    }
    plVar3 = *(long **)((long)ppDVar1 + lVar10 + lVar9 * 8);
    piVar4 = (pointer)*plVar3;
    block->buffer = piVar4;
    piVar11 = (pointer)plVar3[1];
    block->begin = piVar11;
    piVar5 = (pointer)plVar3[2];
    block->end = piVar5;
    piVar8 = (pointer)operator_new(0x400);
    pDVar6 = block;
    piVar11 = (pointer)(((long)piVar11 - (long)piVar4) + (long)piVar8);
    __n = (long)block->end - (long)block->begin;
    if (__n != 0) {
      memmove(piVar11,block->begin,__n);
    }
    pDVar6->begin = piVar11;
    pDVar6->end = (pointer)(((long)piVar5 - (long)piVar4) + (long)piVar8);
    pDVar6->buffer = piVar8;
    RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
    ::push_back(local_50,&block);
    RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
    ::push_back(local_48,&block);
    RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
    ::push_back(local_58,&block);
    lVar10 = lVar10 + 8;
  }
  return;
}

Assistant:

void copy(const Deque<T, Alloc2> &other) {
        for (size_type i = 0; i != other.current_.size(); ++i) {
            DataBlock *block = new DataBlock(*other.current_[i]);
            auto beginOffset = block->begin - block->buffer;
            auto endOffset = block->end - block->buffer;

            pointer ptr = allocator_.allocate(DataBlock::SIZE);
            std::copy(block->begin, block->end, ptr + beginOffset);
            block->begin = ptr + beginOffset;
            block->end = ptr + endOffset;
            block->buffer = ptr;

            small_.push_back(block);
            current_.push_back(block);
            big_.push_back(block);
        }
    }